

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O2

bool storage::cc(int *arr,int cnt)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  lVar2 = 1;
  iVar3 = *arr;
  do {
    lVar4 = lVar2;
    if (cnt <= lVar4) break;
    bVar1 = iVar3 < arr[lVar4];
    lVar2 = lVar4 + 1;
    iVar3 = arr[lVar4];
  } while (bVar1);
  return cnt <= lVar4;
}

Assistant:

bool cc(int *arr, int cnt) {
        int cur = arr[0];
        bool ret = true;
        for (int i = 1; i < cnt; ++i) {
            if (arr[i] > cur)
                cur = arr[i];
            else
                return false;
        }
        return ret;
    }